

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  int local_74;
  undefined1 auStack_70 [4];
  int ret;
  timeval tv;
  nvamemtiming_conf conf;
  unsigned_long total_time;
  unsigned_long start_time;
  char **argv_local;
  int argc_local;
  
  signal(2,signal_handler);
  signal(0xb,signal_handler);
  iVar2 = nva_init();
  if (iVar2 == 0) {
    parse_cmd_line(argc,argv,(nvamemtiming_conf *)&tv.tv_usec);
    iVar2 = vbios_read((char *)conf._8_8_,(uint8_t **)&conf.vbios,(size_t *)&conf.vbios.data);
    if (iVar2 == 1) {
      local_74 = read_timings((nvamemtiming_conf *)&tv.tv_usec);
      if (local_74 == 0) {
        gettimeofday((timeval *)auStack_70,(__timezone_ptr_t)0x0);
        lVar1 = _auStack_70;
        switch(conf.cnum) {
        case 0:
          local_74 = shallow_dump((nvamemtiming_conf *)&tv.tv_usec);
          break;
        case 1:
          local_74 = bitfield_check((nvamemtiming_conf *)&tv.tv_usec);
          break;
        case 2:
          local_74 = manual_check((nvamemtiming_conf *)&tv.tv_usec);
          break;
        case 3:
          local_74 = deep_dump((nvamemtiming_conf *)&tv.tv_usec);
        }
        gettimeofday((timeval *)auStack_70,(__timezone_ptr_t)0x0);
        conf._48_8_ = _auStack_70 - lVar1;
        printf("The run tested %i configurations in %li:%li:%lis\n",(ulong)tv.tv_usec._6_2_,
               (ulong)conf._48_8_ / 0xe10,((ulong)conf._48_8_ % 0xe10) / 0x3c,
               (ulong)conf._48_8_ % 0x3c);
        argv_local._4_4_ = local_74;
      }
      else {
        fprintf(_stderr,"read_timings failed!\n");
        argv_local._4_4_ = local_74;
      }
    }
    else {
      fprintf(_stderr,"Error while reading the vbios\n");
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
	unsigned long start_time, total_time;
	struct nvamemtiming_conf conf;
	struct timeval tv;
	int ret;

	signal(SIGINT, signal_handler);
	signal(SIGSEGV, signal_handler);

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	parse_cmd_line(argc, argv, &conf);

	/* read the vbios */
	if (vbios_read(conf.vbios.file, &conf.vbios.data, &conf.vbios.length) != 1) {
		fprintf(stderr, "Error while reading the vbios\n");
		return 1;
	}

	/* parse the timing table */
	ret = read_timings(&conf);
	if (ret) {
		fprintf(stderr, "read_timings failed!\n");
		return ret;
	}

	/* start the counter to return how long did the run take */
	gettimeofday(&tv, NULL);
	start_time = tv.tv_sec;

	switch (conf.mode) {
	case MODE_AUTO:
		ret = shallow_dump(&conf);
		break;
	case MODE_DEEP:
		ret = deep_dump(&conf);
		break;
	case MODE_BITFIELD:
		ret = bitfield_check(&conf);
		break;
	case MODE_MANUAL:
		ret = manual_check(&conf);
		break;
	}

	gettimeofday(&tv, NULL);
	total_time = tv.tv_sec - start_time;

	printf("The run tested %i configurations in %li:%li:%lis\n",
	       conf.counter,
	       total_time / 3600,
	       (total_time % 3600) / 60,
	       total_time % 60);

	return ret;
}